

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Bytes __thiscall Omega_h::gt_each<double>(Omega_h *this,Read<double> *a,Read<double> *b)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  ulong uVar4;
  ulong uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  LO n;
  size_t sVar7;
  Bytes BVar8;
  Write<signed_char> c;
  type f;
  Write<signed_char> local_78;
  type local_68;
  Write<signed_char> local_38;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar5 = pAVar3->size;
  }
  else {
    uVar5 = (ulong)pAVar3 >> 3;
  }
  if ((int)(uVar4 >> 3) == (int)(uVar5 >> 3)) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar7 = pAVar2->size;
    }
    else {
      sVar7 = (ulong)pAVar2 >> 3;
    }
    local_68.c.shared_alloc_.alloc = (Alloc *)&local_68.a;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    Write<signed_char>::Write(&local_78,(LO)(sVar7 >> 3),(string *)&local_68);
    if (local_68.c.shared_alloc_.alloc != (Alloc *)&local_68.a) {
      operator_delete(local_68.c.shared_alloc_.alloc,
                      (ulong)((long)&(local_68.a.write_.shared_alloc_.alloc)->size + 1));
    }
    local_68.c.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.c.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.c.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    local_68.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_68.a.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.a.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.a.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.a.write_.shared_alloc_.alloc)->use_count =
             (local_68.a.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_68.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_68.b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.b.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.b.write_.shared_alloc_.alloc)->use_count =
             (local_68.b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
    if (((ulong)local_78.shared_alloc_.alloc & 1) == 0) {
      n = (LO)(local_78.shared_alloc_.alloc)->size;
    }
    else {
      n = (LO)((ulong)local_78.shared_alloc_.alloc >> 3);
    }
    parallel_for<Omega_h::gt_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (n,&local_68,"gt_each");
    local_38.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    local_38.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
         local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
      local_38.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_78.shared_alloc_.alloc = (Alloc *)0x0;
    local_78.shared_alloc_.direct_ptr = (void *)0x0;
    Read<signed_char>::Read((Read<signed_char> *)this,&local_38);
    pAVar2 = local_38.shared_alloc_.alloc;
    if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 &&
        local_38.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    gt_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&local_68);
    pAVar2 = local_78.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    BVar8.write_.shared_alloc_.direct_ptr = pvVar6;
    BVar8.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar8.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xf8);
}

Assistant:

Bytes gt_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] > b[i]); };
  parallel_for(c.size(), f, "gt_each");
  return c;
}